

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

void __thiscall llvm::detail::IEEEFloat::initFromHalfAPInt(IEEEFloat *this,APInt *api)

{
  byte *pbVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  Significand SVar5;
  Significand SVar6;
  uint uVar7;
  byte bVar8;
  
  if (api->BitWidth != 0x10) {
    __assert_fail("api.getBitWidth()==16",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc7f,"void llvm::detail::IEEEFloat::initFromHalfAPInt(const APInt &)");
  }
  uVar3 = (api->U).VAL;
  uVar4 = uVar3 >> 10;
  uVar7 = (uint)uVar4 & 0x1f;
  this->semantics = (fltSemantics *)semIEEEhalf;
  bVar2 = this->field_0x12;
  bVar8 = (byte)(uVar3 >> 0xc) & 8;
  this->field_0x12 = bVar2 & 0xf7 | bVar8;
  if ((uVar4 & 0x1f) == 0 && (uVar3 & 0x3ff) == 0) {
    bVar8 = bVar2 & 0xf0 | bVar8 | 3;
  }
  else {
    if (uVar7 != 0x1f || (uVar3 & 0x3ff) != 0) {
      bVar8 = bVar2 & 0xf0 | bVar8;
      if ((uVar3 & 0x3ff) != 0 && uVar7 == 0x1f) {
        this->field_0x12 = bVar8 | 1;
        SVar5._0_4_ = (uint)uVar3 & 0x3ff;
        SVar5.part._4_4_ = 0;
        this->significand = SVar5;
        return;
      }
      SVar6._0_4_ = (uint)uVar3 & 0x3ff;
      SVar6.part._4_4_ = 0;
      this->field_0x12 = bVar8 | 2;
      this->exponent = (short)uVar7 + -0xf;
      this->significand = SVar6;
      if ((uVar4 & 0x1f) != 0) {
        pbVar1 = (byte *)((long)&this->significand + 1);
        *pbVar1 = *pbVar1 | 4;
        return;
      }
      this->exponent = -0xe;
      return;
    }
    bVar8 = bVar2 & 0xf0 | bVar8;
  }
  this->field_0x12 = bVar8;
  return;
}

Assistant:

void IEEEFloat::initFromHalfAPInt(const APInt &api) {
  assert(api.getBitWidth()==16);
  uint32_t i = (uint32_t)*api.getRawData();
  uint32_t myexponent = (i >> 10) & 0x1f;
  uint32_t mysignificand = i & 0x3ff;

  initialize(&semIEEEhalf);
  assert(partCount()==1);

  sign = i >> 15;
  if (myexponent==0 && mysignificand==0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x1f && mysignificand==0) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x1f && mysignificand!=0) {
    // sign, exponent, significand meaningless
    category = fcNaN;
    *significandParts() = mysignificand;
  } else {
    category = fcNormal;
    exponent = myexponent - 15;  //bias
    *significandParts() = mysignificand;
    if (myexponent==0)    // denormal
      exponent = -14;
    else
      *significandParts() |= 0x400; // integer bit
  }
}